

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall
test_matrix_sparse_operator_matrix_multiplication_assignement_Test::
~test_matrix_sparse_operator_matrix_multiplication_assignement_Test
          (test_matrix_sparse_operator_matrix_multiplication_assignement_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_matrix_multiplication_assignement) {
  Matrix_Sparse matrix_0({0, 2, 3, 4, 6, 7}, {0, 2, 2, 0, 1, 4, 3}, {1.0, 2.0, -7.0, 4.0, 3.0, -9.0, 5.0}, 5);
  Matrix_Sparse matrix_1({0, 2, 4, 5, 6, 7}, {1, 4, 0, 3, 1, 4, 2}, {6.0, 9.0, 1.0, -8.0, 6.0, 5.0, -7.0}, 5);

  matrix_0 *= matrix_1;
  EXPECT_EQ(matrix_1.size_row(), 5);
  EXPECT_EQ(matrix_1.size_column(), 5);
  EXPECT_EQ(matrix_1.size_non_zero(), 7);

  EXPECT_EQ(matrix_0.size_row(), 5);
  EXPECT_EQ(matrix_0.size_column(), 5);
  EXPECT_EQ(matrix_0.size_non_zero(), 9);

  EXPECT_DOUBLE_EQ(matrix_0[0][1], 18.0);
  EXPECT_DOUBLE_EQ(matrix_0[0][4], 9.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][1], -42.0);
  EXPECT_DOUBLE_EQ(matrix_0[2][1], 24.0);
  EXPECT_DOUBLE_EQ(matrix_0[2][4], 36.0);
  EXPECT_DOUBLE_EQ(matrix_0[3][0], 3.0);
  EXPECT_DOUBLE_EQ(matrix_0[3][2], 63.0);
  EXPECT_DOUBLE_EQ(matrix_0[3][3], -24.0);
  EXPECT_DOUBLE_EQ(matrix_0[4][4], 25.0);

  // reset
  matrix_0 = Matrix_Sparse({0, 2, 3, 4, 6}, {0, 2, 0, 1, 1, 2}, {2.0, 8.0, -6.0, -3.0, 4.0, 7.0}, 3);
  matrix_1 = Matrix_Sparse({0, 1, 2, 3}, {0, 1, 0}, {6.0, 4.0, -5.0}, 2);
  matrix_0 *= matrix_1;

  EXPECT_EQ(matrix_1.size_row(), 3);
  EXPECT_EQ(matrix_1.size_column(), 2);
  EXPECT_EQ(matrix_1.size_non_zero(), 3);

  EXPECT_EQ(matrix_0.size_row(), 4);
  EXPECT_EQ(matrix_0.size_column(), 2);
  EXPECT_EQ(matrix_0.size_non_zero(), 5);
  EXPECT_DOUBLE_EQ(matrix_0[0][0], -28.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][0], -36.0);
  EXPECT_DOUBLE_EQ(matrix_0[2][1], -12.0);
  EXPECT_DOUBLE_EQ(matrix_0[3][0], -35.0);
  EXPECT_DOUBLE_EQ(matrix_0[3][1], 16.0);

  // reset
  matrix_0 = Matrix_Sparse({0, 2, 3, 4, 6}, {0, 2, 0, 1, 1, 2}, {2.0, 8.0, -6.0, -3.0, 4.0, 7.0}, 3);
  EXPECT_DEATH(matrix_0 *= matrix_0, "./*");
}